

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseMessageWithoutReceiver(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sourcePosition;
  size_t endPosition;
  sysbvm_tuple_t functionExpression;
  sysbvm_tuple_t keywordSourcePosition;
  sysbvm_tuple_t argument;
  sysbvm_tuple_t argumentOrderedCollection;
  sysbvm_tuple_t selectorBuilder;
  size_t keywordEndPosition;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 4) {
    startIndex = state->tokenPosition;
    selectorBuilder = state->tokenPosition;
    sVar2 = sysbvm_stringStream_create(context);
    sVar3 = sysbvm_orderedCollection_create(context);
    while( true ) {
      iVar1 = sysbvm_parser_lookKindAt(state,0);
      if (iVar1 != 4) break;
      sVar4 = sysbvm_parser_lookAt(state,0);
      sVar4 = sysbvm_token_getValue(sVar4);
      sysbvm_stringStream_nextPutString(context,sVar2,sVar4);
      state->tokenPosition = state->tokenPosition + 1;
      selectorBuilder = state->tokenPosition;
      sVar4 = sysbvm_parser_parseBinaryExpression(context,state);
      sysbvm_orderedCollection_add(context,sVar3,sVar4);
    }
    sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,selectorBuilder);
    sVar2 = sysbvm_stringStream_asSymbol(context,sVar2);
    sVar2 = sysbvm_astIdentifierReferenceNode_create(context,sVar4,sVar2);
    sVar4 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,
                       state->tokenPosition);
    sVar3 = sysbvm_orderedCollection_asArray(context,sVar3);
    context_local =
         (sysbvm_context_t *)sysbvm_astUnexpandedApplicationNode_create(context,sVar4,sVar2,sVar3);
  }
  else {
    sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
    context_local =
         (sysbvm_context_t *)
         sysbvm_astErrorNode_createWithCString(context,sVar2,"Expected a subscript left bracket.");
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseMessageWithoutReceiver(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_KEYWORD)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a subscript left bracket.");
    
    size_t startPosition = state->tokenPosition;
    size_t keywordEndPosition = state->tokenPosition;
    sysbvm_tuple_t selectorBuilder = sysbvm_stringStream_create(context);
    sysbvm_tuple_t argumentOrderedCollection = sysbvm_orderedCollection_create(context);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_KEYWORD)
    {
        sysbvm_stringStream_nextPutString(context, selectorBuilder, sysbvm_token_getValue(sysbvm_parser_lookAt(state, 0)));
        ++state->tokenPosition;
        keywordEndPosition = state->tokenPosition;

        sysbvm_tuple_t argument = sysbvm_parser_parseBinaryExpression(context, state);
        sysbvm_orderedCollection_add(context, argumentOrderedCollection, argument);
    }

    sysbvm_tuple_t keywordSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, keywordEndPosition);
    sysbvm_tuple_t functionExpression = sysbvm_astIdentifierReferenceNode_create(context, keywordSourcePosition, sysbvm_stringStream_asSymbol(context, selectorBuilder));

    size_t endPosition = state->tokenPosition;
    sysbvm_tuple_t sourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition);
    return sysbvm_astUnexpandedApplicationNode_create(context, sourcePosition, functionExpression, sysbvm_orderedCollection_asArray(context, argumentOrderedCollection));
}